

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ClockingPropertyExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClockingPropertyExprSyntax *this,size_t index)

{
  SyntaxNode *node;
  size_t index_local;
  ClockingPropertyExprSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::TimingControlSyntax_*>::get(&this->event)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->expr->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClockingPropertyExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return event.get();
        case 1: return expr;
        default: return nullptr;
    }
}